

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O3

int Int_ManGlobalVars(Int_Man_t *p)

{
  Sto_Man_t *pSVar1;
  int *piVar2;
  Sto_Cls_t **ppSVar3;
  uint uVar4;
  Sto_Cls_t *pSVar5;
  Sto_Cls_t *pSVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  pSVar1 = p->pCnf;
  pSVar6 = pSVar1->pHead;
  pSVar5 = pSVar6;
  if (pSVar6 == (Sto_Cls_t *)0x0) {
    iVar10 = p->nGloVars;
    if (iVar10 != 0) goto LAB_0054b2d4;
  }
  else {
    do {
      if ((~*(uint *)&pSVar5->field_0x1c & 3) != 0) break;
      if ((*(uint *)&pSVar5->field_0x1c & 0x7fffff8) != 0) {
        piVar2 = p->pVarTypes;
        uVar8 = 0;
        do {
          piVar2[*(int *)((long)&pSVar5[1].pNext + uVar8 * 4) >> 1] = 1;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (*(uint *)&pSVar5->field_0x1c >> 3 & 0xffffff));
      }
      ppSVar3 = &pSVar5->pNext;
      pSVar5 = *ppSVar3;
    } while (*ppSVar3 != (Sto_Cls_t *)0x0);
    iVar10 = p->nGloVars;
    if (iVar10 != 0) {
LAB_0054b2d4:
      if (iVar10 < 1) {
        return iVar10;
      }
      piVar2 = p->pVarTypes;
      iVar10 = -1;
      lVar7 = 0;
      do {
        piVar2[p->pGloVars[lVar7]] = iVar10;
        lVar7 = lVar7 + 1;
        iVar10 = iVar10 + -1;
      } while (lVar7 < p->nGloVars);
      return p->nGloVars;
    }
    for (; pSVar6 != (Sto_Cls_t *)0x0; pSVar6 = pSVar6->pNext) {
      uVar4 = *(uint *)&pSVar6->field_0x1c;
      uVar8 = (ulong)uVar4;
      if ((uVar4 & 2) == 0) break;
      if ((uVar4 & 0x7fffff8) != 0 && (uVar4 & 1) == 0) {
        piVar2 = p->pVarTypes;
        uVar9 = 0;
        do {
          iVar10 = *(int *)((long)&pSVar6[1].pNext + uVar9 * 4) >> 1;
          if (piVar2[iVar10] == 1) {
            piVar2[iVar10] = -1;
            uVar8 = (ulong)*(uint *)&pSVar6->field_0x1c;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < ((uint)(uVar8 >> 3) & 0xffffff));
      }
    }
  }
  iVar10 = pSVar1->nVars;
  if (0 < iVar10) {
    piVar2 = p->pVarTypes;
    lVar7 = 0;
    uVar4 = 0;
    do {
      if (piVar2[lVar7] == -1) {
        piVar2[lVar7] = ~uVar4;
        iVar10 = pSVar1->nVars;
        uVar4 = uVar4 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar10);
    return uVar4;
  }
  return 0;
}

Assistant:

int Int_ManGlobalVars( Int_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, nVarsAB, v;

    // mark the variable encountered in the clauses of A
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA )
            break;
        for ( v = 0; v < (int)pClause->nLits; v++ )
            p->pVarTypes[lit_var(pClause->pLits[v])] = 1;
    }

    if ( p->nGloVars )
    {
        for ( v = 0; v < p->nGloVars; v++ )
            p->pVarTypes[ p->pGloVars[v] ] = - v - 1;
        return p->nGloVars;
    }

    // check variables that appear in clauses of B
    nVarsAB = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( pClause->fA )
            continue;
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] == 1 ) // var of A
            {
                // change it into a global variable
                nVarsAB++;
                p->pVarTypes[Var] = -1;
            }
        }
    }

    // order global variables
    nVarsAB = 0;
    for ( v = 0; v < p->pCnf->nVars; v++ )
        if ( p->pVarTypes[v] == -1 )
            p->pVarTypes[v] -= nVarsAB++;
//printf( "There are %d global variables.\n", nVarsAB );
    return nVarsAB;
}